

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O0

void __thiscall packing::ProtoPalAttrs::banFrom(ProtoPalAttrs *this,size_t index)

{
  size_type sVar1;
  reference local_28;
  ulong local_18;
  size_t index_local;
  ProtoPalAttrs *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  sVar1 = std::vector<bool,_std::allocator<bool>_>::size(&this->bannedPages);
  if (sVar1 <= local_18) {
    std::vector<bool,_std::allocator<bool>_>::resize(&this->bannedPages,local_18 + 1,false);
  }
  local_28 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->bannedPages,local_18);
  std::_Bit_reference::operator=(&local_28,true);
  return;
}

Assistant:

void banFrom(size_t index) {
		if (bannedPages.size() <= index) {
			bannedPages.resize(index + 1);
		}
		bannedPages[index] = true;
	}